

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_39a3::Test_TemplateDictionary_IsHiddenSectionDefault::
Test_TemplateDictionary_IsHiddenSectionDefault(Test_TemplateDictionary_IsHiddenSectionDefault *this)

{
  value_type local_18;
  Test_TemplateDictionary_IsHiddenSectionDefault *local_10;
  Test_TemplateDictionary_IsHiddenSectionDefault *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(TemplateDictionary, IsHiddenSectionDefault) {
  TemplateDictionary dict("dict");
  TemplateDictionaryPeer peer(&dict);
  EXPECT_TRUE(peer.IsHiddenSection("UNDEFINED"));
  EXPECT_FALSE(peer.IsUnhiddenSection("UNDEFINED"));
  dict.ShowSection("VISIBLE");
  EXPECT_FALSE(peer.IsHiddenSection("VISIBLE"));
  EXPECT_TRUE(peer.IsUnhiddenSection("VISIBLE"));
}